

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

http_status_code parse_status_code(sub_string *text)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  size_t sVar5;
  http_parsing_error *phVar6;
  char *pcVar7;
  uint result;
  sub_string *text_local;
  
  sVar5 = sub_string::size(text);
  if (sVar5 < 3) {
    phVar6 = (http_parsing_error *)__cxa_allocate_exception(0x10);
    http_parsing_error::http_parsing_error(phVar6,"invalid status code");
    __cxa_throw(phVar6,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
  }
  pcVar7 = sub_string::operator[](text,0);
  bVar4 = http_is_digit(*pcVar7);
  if (bVar4) {
    pcVar7 = sub_string::operator[](text,1);
    bVar4 = http_is_digit(*pcVar7);
    if (bVar4) {
      pcVar7 = sub_string::operator[](text,2);
      bVar4 = http_is_digit(*pcVar7);
      if (bVar4) {
        pcVar7 = sub_string::operator[](text,0);
        cVar1 = *pcVar7;
        pcVar7 = sub_string::operator[](text,1);
        cVar2 = *pcVar7;
        pcVar7 = sub_string::operator[](text,2);
        cVar3 = *pcVar7;
        sub_string::advance(text,3);
        return (cVar1 + -0x30) * 100 + (cVar2 + -0x30) * 10 + cVar3 + -0x30;
      }
    }
  }
  phVar6 = (http_parsing_error *)__cxa_allocate_exception(0x10);
  http_parsing_error::http_parsing_error(phVar6,"invalid status code");
  __cxa_throw(phVar6,&http_parsing_error::typeinfo,http_parsing_error::~http_parsing_error);
}

Assistant:

http_status_code parse_status_code(sub_string& text)
{
    if (text.size() < 3)
        throw http_parsing_error("invalid status code");

    if (!http_is_digit(text[0])
     || !http_is_digit(text[1])
     || !http_is_digit(text[2]))
        throw http_parsing_error("invalid status code");

    unsigned result = (text[0] - '0') * 100
                    + (text[1] - '0') * 10
                    + (text[2] - '0');

    text.advance(3);

    return static_cast<http_status_code>(result);
}